

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O2

t_int * clip_perform(t_int *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  t_int tVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  lVar1 = w[1];
  lVar2 = w[2];
  lVar3 = w[3];
  tVar4 = w[4];
  for (lVar5 = 0; (int)tVar4 != (int)lVar5; lVar5 = lVar5 + 1) {
    fVar6 = *(float *)(lVar1 + 0x34);
    fVar7 = *(float *)(lVar2 + lVar5 * 4);
    if (fVar6 <= fVar7) {
      fVar6 = fVar7;
    }
    fVar7 = *(float *)(lVar1 + 0x38);
    if (fVar6 <= fVar7) {
      fVar7 = fVar6;
    }
    *(float *)(lVar3 + lVar5 * 4) = fVar7;
  }
  return w + 5;
}

Assistant:

static t_int *clip_perform(t_int *w)
{
    t_clip *x = (t_clip *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample f = *in++;
        if (f < x->x_lo) f = x->x_lo;
        if (f > x->x_hi) f = x->x_hi;
        *out++ = f;
    }
    return (w+5);
}